

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

_Bool rf_check_collision_point_triangle(rf_vec2 point,rf_vec2 p1,rf_vec2 p2,rf_vec2 p3)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  byte bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar7 = p3.x;
  fVar6 = p3.y;
  fVar8 = fVar7 - p2.x;
  fVar4 = p2.y - fVar6;
  fVar1 = point.x - fVar7;
  fVar2 = point.y - fVar6;
  fVar7 = p1.x - fVar7;
  fVar3 = fVar4 * fVar7 + (p1.y - fVar6) * fVar8;
  fVar4 = (fVar4 * fVar1 + fVar8 * fVar2) / fVar3;
  if (fVar4 <= 0.0) {
    bVar5 = 0;
  }
  else {
    fVar3 = ((fVar6 - p1.y) * fVar1 + fVar7 * fVar2) / fVar3;
    bVar5 = -(fVar3 < 1.0 - fVar4) & -(0.0 < fVar3);
  }
  return (_Bool)(bVar5 & 1);
}

Assistant:

bool rf_check_collision_point_triangle(rf_vec2 point, rf_vec2 p1, rf_vec2 p2, rf_vec2 p3)
{
    bool collision = 0;

    float alpha = ((p2.y - p3.y) * (point.x - p3.x) + (p3.x - p2.x) * (point.y - p3.y)) /
                  ((p2.y - p3.y) * (p1.x - p3.x) + (p3.x - p2.x) * (p1.y - p3.y));

    float beta = ((p3.y - p1.y) * (point.x - p3.x) + (p1.x - p3.x) * (point.y - p3.y)) /
                 ((p2.y - p3.y) * (p1.x - p3.x) + (p3.x - p2.x) * (p1.y - p3.y));

    float gamma = 1.0f - alpha - beta;

    if ((alpha > 0) && (beta > 0) & (gamma > 0)) collision = 1;

    return collision;
}